

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::reservedPpErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *identifier,char *op)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *op_local;
  char *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar2 = strncmp(identifier,"GL_",3);
  if ((iVar2 == 0) &&
     (uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_spirv_intrinsics"), (uVar3 & 1) == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2f])
              (this,loc,"names beginning with \"GL_\" can\'t be (un)defined:",op,identifier);
  }
  else {
    iVar2 = strncmp(identifier,"defined",8);
    if (iVar2 == 0) {
      bVar1 = TParseVersions::relaxedErrors((TParseVersions *)this);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x30])
                  (this,loc,"\"defined\" is (un)defined:",op,identifier);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2f])
                  (this,loc,"\"defined\" can\'t be (un)defined:",op,identifier);
      }
    }
    else {
      pcVar4 = strstr(identifier,"__");
      if ((pcVar4 != (char *)0x0) &&
         (uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_EXT_spirv_intrinsics"), (uVar3 & 1) == 0)) {
        bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
        if (((bVar1) && (299 < (this->super_TParseContextBase).super_TParseVersions.version)) &&
           (((iVar2 = strcmp(identifier,"__LINE__"), iVar2 == 0 ||
             (iVar2 = strcmp(identifier,"__FILE__"), iVar2 == 0)) ||
            (iVar2 = strcmp(identifier,"__VERSION__"), iVar2 == 0)))) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2f])
                    (this,loc,"predefined names can\'t be (un)defined:",op,identifier);
        }
        else {
          bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
          if (((!bVar1) || (299 < (this->super_TParseContextBase).super_TParseVersions.version)) ||
             (bVar1 = TParseVersions::relaxedErrors((TParseVersions *)this), bVar1)) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x30])
                      (this,loc,"names containing consecutive underscores are reserved:",op,
                       identifier);
          }
          else {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2f])
                      (this,loc,
                       "names containing consecutive underscores are reserved, and an error if version < 300:"
                       ,op,identifier);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::reservedPpErrorCheck(const TSourceLoc& loc, const char* identifier, const char* op)
{
    // "__" are not supposed to be an error.  ES 300 (and desktop) added the clarification:
    // "All macro names containing two consecutive underscores ( __ ) are reserved;
    // defining such a name does not itself result in an error, but may result in
    // undefined behavior.  All macro names prefixed with "GL_" ("GL" followed by a
    // single underscore) are also reserved, and defining such a name results in a
    // compile-time error."
    // however, before that, ES tests required an error.
    if (strncmp(identifier, "GL_", 3) == 0 && !extensionTurnedOn(E_GL_EXT_spirv_intrinsics))
        // The extension GL_EXT_spirv_intrinsics allows us to declare macros prefixed with "GL_".
        ppError(loc, "names beginning with \"GL_\" can't be (un)defined:", op,  identifier);
    else if (strncmp(identifier, "defined", 8) == 0)
        if (relaxedErrors())
            ppWarn(loc, "\"defined\" is (un)defined:", op,  identifier);
        else
            ppError(loc, "\"defined\" can't be (un)defined:", op,  identifier);
    else if (strstr(identifier, "__") != nullptr && !extensionTurnedOn(E_GL_EXT_spirv_intrinsics)) {
        // The extension GL_EXT_spirv_intrinsics allows us to declare macros prefixed with "__".
        if (isEsProfile() && version >= 300 &&
            (strcmp(identifier, "__LINE__") == 0 ||
             strcmp(identifier, "__FILE__") == 0 ||
             strcmp(identifier, "__VERSION__") == 0))
            ppError(loc, "predefined names can't be (un)defined:", op,  identifier);
        else {
            if (isEsProfile() && version < 300 && !relaxedErrors())
                ppError(loc, "names containing consecutive underscores are reserved, and an error if version < 300:", op, identifier);
            else
                ppWarn(loc, "names containing consecutive underscores are reserved:", op, identifier);
        }
    }
}